

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O2

int parse_pmc_id(uint32_t pmc_id,chipset_info *info)

{
  uint uVar1;
  gpu_index gVar2;
  int iVar3;
  uint uVar4;
  _Bool *p_Var5;
  int i;
  ulong uVar6;
  ulong uStack_8;
  
  *(undefined8 *)&info->gpu = 0;
  info->gpu_desc = (gpu *)0x0;
  info->pmc_id = 0;
  info->chipset = 0;
  info->card_type = 0;
  info->endian = 0;
  info->gpu = GPU_UNKNOWN;
  if ((pmc_id & 0xf80) != 0x80 && (int)pmc_id < 0) {
    info->endian = 1;
    pmc_id = pmc_id >> 0x18 | (pmc_id & 0xff0000) >> 8 | (pmc_id & 0xff00) << 8 | pmc_id << 0x18;
  }
  info->pmc_id = pmc_id;
  if ((int)pmc_id < 0 && (pmc_id & 0xf00) != 0) {
    return -1;
  }
  if (-1 < (char)pmc_id) {
    if ((pmc_id & 0xf000) == 0) {
      uVar1 = pmc_id >> 0x10 & 0xf;
      info->chipset = uVar1;
      info->card_type = uVar1;
      if (uVar1 == 3) {
        if ((pmc_id & 0x60) == 0) {
          info->gpu = GPU_NV3;
          uStack_8 = 1;
        }
        else {
          info->gpu = GPU_NV3T;
          uStack_8 = 2;
        }
      }
      else {
        if (uVar1 != 1) {
          return -1;
        }
        info->gpu = GPU_NV1;
        uStack_8 = 0;
      }
    }
    else {
      uVar1 = (uint)((pmc_id & 0xf00000) == 0);
      gVar2 = GPU_NV5 - uVar1;
      uStack_8 = (ulong)gVar2;
      info->chipset = uVar1 ^ 5;
      info->gpu = gVar2;
      info->card_type = 4;
    }
    goto LAB_00102f32;
  }
  uVar1 = pmc_id >> 0x14 & 0x1ff;
  info->chipset = uVar1;
  uVar4 = pmc_id >> 0x14 & 0x1f0;
  info->card_type = uVar4;
  if (uVar4 == 0x60) {
    iVar3 = 0x40;
LAB_00102ef9:
    info->card_type = iVar3;
  }
  else {
    if (uVar4 - 0x80 < 0x21) {
      iVar3 = 0x50;
      goto LAB_00102ef9;
    }
    iVar3 = 0xc0;
    if (uVar4 - 0xc0 < 0x41) goto LAB_00102ef9;
  }
  p_Var5 = &gpu_list[0].id_valid;
  uStack_8 = 0x5c;
  for (uVar6 = 0; uVar6 != 0x5c; uVar6 = uVar6 + 1) {
    if ((*p_Var5 == true) && (*(uint32_t *)(p_Var5 + -4) == uVar1)) {
      info->gpu = (gpu_index)uVar6;
      uStack_8 = uVar6 & 0xffffffff;
    }
    p_Var5 = p_Var5 + 0x40;
  }
  if ((int)uStack_8 == 0x5c) {
    return -1;
  }
LAB_00102f32:
  info->gpu_desc = gpu_list + uStack_8;
  return 0;
}

Assistant:

int parse_pmc_id(uint32_t pmc_id, struct chipset_info *info) {
	/* First, detect PMC_ID format and endianness */
	memset(info, 0, sizeof *info);
	info->endian = 0;
	info->gpu = GPU_UNKNOWN;
	info->gpu_desc = 0;
	if (pmc_id_flipped(pmc_id)) {
		/* bit 31 set - set endian flag and byteswap */
		info->endian = 1;
		pmc_id = (pmc_id & 0x0000ffff) << 16 | (pmc_id & 0xffff0000) >> 16;
		pmc_id = (pmc_id & 0x00ff00ff) << 8 | (pmc_id & 0xff00ff00) >> 8;
	}
	info->pmc_id = pmc_id;
	if (pmc_id & 0x80000000 && pmc_id & 0x00000F00) {
		/* bit 31 still set - ie. old bit 7 was set, and bits 8-11 are
		 * still nonzero - BAR0 is broken */
		return -1;
	}
	if (pmc_id & 0x80) {
		/* NV10+ */
		info->chipset = pmc_id >> 20 & 0x1ff;
		info->card_type = info->chipset & 0x1f0;
		if (info->card_type == 0x60) {
			info->card_type = 0x40;
		} else if (info->card_type >= 0x80 && info->card_type <= 0xa0) {
			info->card_type = 0x50;
		} else if (info->card_type >= 0xc0 && info->card_type <= 0x100) {
			info->card_type = 0xc0;
		}
		for (int i = 0; i < NUM_GPU; i++) {
			if (gpu_list[i].id_valid && gpu_list[i].id == info->chipset) {
				info->gpu = i;
			}
		}
	} else {
		/* pre-NV10 */
		if (pmc_id & 0xf000) {
			if (pmc_id & 0xf00000) {
				info->chipset = 5;
				info->gpu = GPU_NV5;
			} else {
				info->chipset = 4;
				info->gpu = GPU_NV4;
			}
			info->card_type = 4;
		} else {
			info->chipset = pmc_id >> 16 & 0xf;
			info->card_type = info->chipset;
			if (info->chipset == 1) {
				info->gpu = GPU_NV1;
			} else if (info->chipset == 3) {
				if ((pmc_id & 0xff) >= 0x20) {
					info->gpu = GPU_NV3T;
				} else {
					info->gpu = GPU_NV3;
				}
			}
		}
	}
	if (info->gpu != GPU_UNKNOWN) {
		info->gpu_desc = &gpu_list[info->gpu];
		return 0;
	} else {
		return -1;
	}
}